

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O2

O3DGCErrorCode __thiscall
o3dgc::CompressedTriangleFans::Save
          (CompressedTriangleFans *this,BinaryStream *bstream,bool encodeTrianglesOrder,
          O3DGCStreamType streamType)

{
  if (streamType == O3DGC_STREAM_TYPE_ASCII) {
    SaveUIntData(&this->m_numTFANs,bstream);
    SaveUIntData(&this->m_degrees,bstream);
    SaveUIntData(&this->m_configs,bstream);
    SaveBinData(&this->m_operations,bstream);
    SaveIntData(&this->m_indices,bstream);
    if (encodeTrianglesOrder) {
      SaveUIntData(&this->m_trianglesOrder,bstream);
    }
  }
  else {
    SaveIntACEGC(this,&this->m_numTFANs,4,bstream);
    SaveIntACEGC(this,&this->m_degrees,0x10,bstream);
    SaveUIntAC(this,&this->m_configs,10,bstream);
    SaveBinAC(this,&this->m_operations,bstream);
    SaveIntACEGC(this,&this->m_indices,8,bstream);
    if (encodeTrianglesOrder) {
      SaveIntACEGC(this,&this->m_trianglesOrder,0x10,bstream);
    }
  }
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    CompressedTriangleFans::Save(BinaryStream & bstream, bool encodeTrianglesOrder, O3DGCStreamType streamType) 
    {
#ifdef DEBUG_VERBOSE
        g_fileDebugTF = fopen("SaveIntACEGC_new.txt", "w");
#endif //DEBUG_VERBOSE

        if (streamType == O3DGC_STREAM_TYPE_ASCII)
        {
            SaveUIntData(m_numTFANs  , bstream);
            SaveUIntData(m_degrees   , bstream);
            SaveUIntData(m_configs   , bstream);
            SaveBinData (m_operations, bstream);
            SaveIntData (m_indices   , bstream);
            if (encodeTrianglesOrder)
            {
                SaveUIntData(m_trianglesOrder, bstream);
            }
        }
        else
        {
            SaveIntACEGC(m_numTFANs  , 4 , bstream);
            SaveIntACEGC(m_degrees   , 16, bstream);
            SaveUIntAC  (m_configs   , 10, bstream);
            SaveBinAC   (m_operations,     bstream);
            SaveIntACEGC(m_indices   , 8 , bstream);
            if (encodeTrianglesOrder)
            {
                SaveIntACEGC(m_trianglesOrder , 16, bstream);
            }
        }
#ifdef DEBUG_VERBOSE
        fclose(g_fileDebugTF);
#endif //DEBUG_VERBOSE
        return O3DGC_OK;
    }